

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_comp_fixup(jit_State *J,BCIns *pc,int cond)

{
  byte bVar1;
  ushort uVar2;
  BCReg BVar3;
  SnapShot *pSVar4;
  SnapEntry *pSVar5;
  int iVar6;
  BCReg BVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  uint8_t auStack_138 [264];
  
  uVar9 = pc[1] >> 8 & 0xff;
  iVar6 = (pc[1] >> 0x10) - 0x8000;
  if (cond == 0) {
    iVar6 = 0;
  }
  uVar10 = (ulong)(J->cur).nsnap;
  pSVar4 = (J->cur).snap;
  (J->cur).snapmap[(uint)pSVar4[uVar10 - 1].nent + pSVar4[uVar10 - 1].mapofs] =
       (int)pc + 8 + iVar6 * 4;
  J->needsnap = '\x01';
  if (uVar9 < J->maxslot) {
    J->maxslot = uVar9;
    lj_snap_shrink(J);
    return;
  }
  pSVar4 = (J->cur).snap;
  uVar2 = (J->cur).nsnap;
  uVar9 = pSVar4[(ulong)uVar2 - 1].mapofs;
  pSVar5 = (J->cur).snapmap;
  bVar1 = pSVar4[(ulong)uVar2 - 1].nent;
  uVar10 = (ulong)bVar1;
  uVar14 = J->maxslot;
  BVar3 = J->baseslot;
  BVar7 = snap_usedef(J,auStack_138,(BCIns *)(ulong)pSVar5[uVar9 + uVar10],uVar14);
  if (BVar7 < uVar14) {
    snap_useuv(J->pt,auStack_138);
  }
  pSVar4[(ulong)uVar2 - 1].nslots = (uint8_t)(uVar14 + BVar3);
  if (bVar1 == 0) {
    uVar14 = ~uVar9 + (J->cur).nsnapmap;
    uVar8 = 0;
  }
  else {
    uVar11 = 0;
    uVar8 = 0;
    do {
      uVar12 = pSVar5[uVar9 + uVar11] >> 0x18;
      if ((uVar12 < BVar7 + BVar3) ||
         ((uVar12 < uVar14 + BVar3 && (auStack_138[uVar12 - BVar3] == '\0')))) {
        uVar13 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        pSVar5[uVar9 + uVar13] = pSVar5[uVar9 + uVar11];
      }
      uVar11 = uVar11 + 1;
    } while (uVar10 != uVar11);
    uVar12 = pSVar4[(ulong)uVar2 - 1].mapofs;
    pSVar4[(ulong)uVar2 - 1].nent = (uint8_t)uVar8;
    uVar14 = ~uVar12 + (J->cur).nsnapmap;
    if (uVar14 < bVar1) goto LAB_001532db;
  }
  do {
    uVar12 = (int)uVar10 + 1;
    uVar11 = (ulong)uVar8;
    uVar8 = uVar8 + 1;
    pSVar5[uVar9 + uVar11] = pSVar5[uVar9 + uVar10];
    uVar10 = (ulong)uVar12;
  } while (uVar12 <= uVar14);
  uVar12 = pSVar4[(ulong)uVar2 - 1].mapofs;
LAB_001532db:
  (J->cur).nsnapmap = uVar12 + uVar8;
  return;
}

Assistant:

static void rec_comp_fixup(jit_State *J, const BCIns *pc, int cond)
{
  BCIns jmpins = pc[1];
  const BCIns *npc = pc + 2 + (cond ? bc_j(jmpins) : 0);
  SnapShot *snap = &J->cur.snap[J->cur.nsnap-1];
  /* Set PC to opposite target to avoid re-recording the comp. in side trace. */
#if LJ_FR2
  SnapEntry *flink = &J->cur.snapmap[snap->mapofs + snap->nent];
  uint64_t pcbase;
  memcpy(&pcbase, flink, sizeof(uint64_t));
  pcbase = (pcbase & 0xff) | (u64ptr(npc) << 8);
  memcpy(flink, &pcbase, sizeof(uint64_t));
#else
  J->cur.snapmap[snap->mapofs + snap->nent] = SNAP_MKPC(npc);
#endif
  J->needsnap = 1;
  if (bc_a(jmpins) < J->maxslot) J->maxslot = bc_a(jmpins);
  lj_snap_shrink(J);  /* Shrink last snapshot if possible. */
}